

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_token.c
# Opt level: O0

size_t StringToken_GetLength(STRING_TOKEN_HANDLE token)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  size_t result;
  STRING_TOKEN_HANDLE token_local;
  
  if (token == (STRING_TOKEN_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/string_token.c"
                ,"StringToken_GetLength",0x102,1,"Invalig argument (token is NULL)");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if (token->token_start == (char *)0x0) {
    l = (LOGGER_LOG)0x0;
  }
  else if (token->delimiter_start == (char *)0x0) {
    l = (LOGGER_LOG)(token->source + (token->length - (long)token->token_start));
  }
  else {
    l = (LOGGER_LOG)(token->delimiter_start + -(long)token->token_start);
  }
  return (size_t)l;
}

Assistant:

size_t StringToken_GetLength(STRING_TOKEN_HANDLE token)
{
    size_t result;

    // Codes_SRS_STRING_TOKENIZER_09_015: [ If token is NULL the function shall return zero ]
    if (token == NULL)
    {
        LogError("Invalig argument (token is NULL)");
        result = 0;
    }
    // Codes_SRS_STRING_TOKENIZER_09_016: [ The function shall return the length of the current token ]
    else if (token->token_start == NULL)
    {
        result = 0;
    }
    else if (token->delimiter_start == NULL)
    {
        result = token->source + token->length - token->token_start;
    }
    else
    {
        result = token->delimiter_start - token->token_start;
    }

    return result;
}